

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Production * new_production(Grammar *g,char *name)

{
  uint uVar1;
  size_t sVar2;
  Production *pPVar3;
  Production *p;
  char *name_local;
  Grammar *g_local;
  
  sVar2 = strlen(name);
  pPVar3 = lookup_production(g,name,(uint)sVar2);
  if (pPVar3 != (Production *)0x0) {
    free(name);
    return pPVar3;
  }
  pPVar3 = (Production *)malloc(0xf0);
  memset(pPVar3,0,0xf0);
  if ((g->productions).v == (Production **)0x0) {
    (g->productions).v = (g->productions).e;
    uVar1 = (g->productions).n;
    (g->productions).n = uVar1 + 1;
    (g->productions).e[uVar1] = pPVar3;
  }
  else {
    if ((g->productions).v == (g->productions).e) {
      if ((g->productions).n < 3) {
        uVar1 = (g->productions).n;
        (g->productions).n = uVar1 + 1;
        (g->productions).v[uVar1] = pPVar3;
        goto LAB_0013cbd6;
      }
    }
    else if (((g->productions).n & 7) != 0) {
      uVar1 = (g->productions).n;
      (g->productions).n = uVar1 + 1;
      (g->productions).v[uVar1] = pPVar3;
      goto LAB_0013cbd6;
    }
    vec_add_internal(&g->productions,pPVar3);
  }
LAB_0013cbd6:
  pPVar3->name = name;
  sVar2 = strlen(name);
  pPVar3->name_len = (uint)sVar2;
  return pPVar3;
}

Assistant:

Production *new_production(Grammar *g, char *name) {
  Production *p;
  if ((p = lookup_production(g, name, strlen(name)))) {
    FREE(name);
    return p;
  }
  p = MALLOC(sizeof(Production));
  memset(p, 0, sizeof(Production));
  vec_add(&g->productions, p);
  p->name = name;
  p->name_len = strlen(name);
  return p;
}